

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void Log::setFormat(String *lineFormat,String *timeFormat)

{
  Guard local_20;
  Guard guard;
  String *timeFormat_local;
  String *lineFormat_local;
  
  guard._mutex = (Mutex *)timeFormat;
  Mutex::Guard::Guard(&local_20,&_Log::mutex);
  String::operator=(&_Log::lineFormat,lineFormat);
  String::operator=(&_Log::timeFormat,(String *)guard._mutex);
  Mutex::Guard::~Guard(&local_20);
  return;
}

Assistant:

void Log::setFormat(const String& lineFormat, const String& timeFormat)
{
  Mutex::Guard guard(_Log::mutex);
  _Log::lineFormat = lineFormat;
  _Log::timeFormat = timeFormat;
}